

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaVector * __thiscall NaVector::scalar_multiply(NaVector *this,NaVector *rVect1,NaVector *rVect2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  long *in_RDX;
  long *in_RSI;
  NaVector *in_RDI;
  uint i;
  uint local_1c;
  
  iVar1 = (**(code **)(*in_RSI + 0x30))();
  iVar2 = (**(code **)(*in_RDX + 0x30))();
  if (iVar1 != iVar2) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 2;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  uVar3 = (**(code **)(*in_RSI + 0x30))();
  (*in_RDI->_vptr_NaVector[4])(in_RDI,(ulong)uVar3);
  local_1c = 0;
  while( true ) {
    uVar3 = (*in_RDI->_vptr_NaVector[6])();
    if (uVar3 <= local_1c) break;
    in_RDI->pVect[local_1c] =
         *(double *)(in_RSI[2] + (ulong)local_1c * 8) * *(double *)(in_RDX[2] + (ulong)local_1c * 8)
    ;
    local_1c = local_1c + 1;
  }
  return in_RDI;
}

Assistant:

NaVector&
NaVector::scalar_multiply (const NaVector& rVect1, const NaVector& rVect2)
{
    if(rVect1.dim() != rVect2.dim())
        throw(na_size_mismatch);

    new_dim(rVect1.dim());

    unsigned    i;
    for(i = 0; i < dim(); ++i)
        pVect[i] = rVect1.pVect[i] * rVect2.pVect[i];

    return *this;
}